

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

SchemeObject * Eval(SchemeObject *exp,SchemeObject *environ)

{
  char cVar1;
  SchemeObject *pSVar2;
  SchemeObject *body;
  SchemeObject *local_40;
  SchemeObject *result;
  SchemeObject *arguments;
  SchemeObject *procedure;
  SchemeObject *environ_local;
  SchemeObject *exp_local;
  
  procedure = environ;
  environ_local = exp;
  while( true ) {
    cVar1 = IsSelfEvaluating(environ_local);
    if (cVar1 != '\0') {
      return environ_local;
    }
    cVar1 = IsVariable(environ_local);
    if (cVar1 != '\0') {
      pSVar2 = LookupVariableValue(environ_local,procedure);
      return pSVar2;
    }
    cVar1 = IsQuote(environ_local);
    if (cVar1 != '\0') {
      pSVar2 = TextOfQuotation(environ_local);
      return pSVar2;
    }
    cVar1 = IsAssignment(environ_local);
    if (cVar1 != '\0') break;
    cVar1 = IsDefine(environ_local);
    if (cVar1 != '\0') {
      pSVar2 = EvalDefinition(environ_local,procedure);
      return pSVar2;
    }
    cVar1 = IsIf(environ_local);
    if (cVar1 == '\0') {
      cVar1 = IsLambda(environ_local);
      if (cVar1 != '\0') {
        pSVar2 = LambdaParameters(environ_local);
        body = LambdaBody(environ_local);
        pSVar2 = MakeCompoundProc(pSVar2,body,procedure);
        return pSVar2;
      }
      cVar1 = IsBegin(environ_local);
      if (cVar1 == '\0') {
        cVar1 = IsCond(environ_local);
        if (cVar1 == '\0') {
          cVar1 = IsLet(environ_local);
          if (cVar1 == '\0') {
            cVar1 = IsAnd(environ_local);
            if (cVar1 == '\0') {
              cVar1 = IsOr(environ_local);
              if (cVar1 == '\0') {
                cVar1 = IsApplication(environ_local);
                if (cVar1 == '\0') {
                  fprintf(_stderr,"cannot eval unknown expression type.\n");
                  exit(1);
                }
                pSVar2 = Operator(environ_local);
                arguments = Eval(pSVar2,procedure);
                pSVar2 = Operands(environ_local);
                result = ListOfValues(pSVar2,procedure);
                cVar1 = IsPrimitiveProc(arguments);
                if ((cVar1 == '\0') || ((arguments->data).pair.car != (SchemeObject *)EvalProc)) {
                  cVar1 = IsPrimitiveProc(arguments);
                  if ((cVar1 != '\0') && ((arguments->data).pair.car == (SchemeObject *)ApplyProc))
                  {
                    arguments = ApplyOperator(result);
                    result = ApplyOperands(result);
                  }
                  cVar1 = IsPrimitiveProc(arguments);
                  if (cVar1 != '\0') {
                    pSVar2 = (SchemeObject *)(*(code *)(arguments->data).symbol.value)(result);
                    return pSVar2;
                  }
                  cVar1 = IsCompoundProc(arguments);
                  if (cVar1 == '\0') {
                    fprintf(_stderr,"unknown procedure type.\n");
                    exit(1);
                  }
                  procedure = ExtendEnvironment((arguments->data).pair.car,result,
                                                (arguments->data).compound_proc.env);
                  environ_local = MakeBegin((arguments->data).pair.cdr);
                }
                else {
                  environ_local = EvalExpression(result);
                  procedure = EvalEnvironment(result);
                }
              }
              else {
                environ_local = OrTests(environ_local);
                cVar1 = IsTheEmptyList(environ_local);
                if (cVar1 != '\0') {
                  return False;
                }
                while (cVar1 = IsLastExp(environ_local), cVar1 == '\0') {
                  pSVar2 = FirstExp(environ_local);
                  pSVar2 = Eval(pSVar2,procedure);
                  cVar1 = IsTrue(pSVar2);
                  if (cVar1 != '\0') {
                    return True;
                  }
                  environ_local = RestExps(environ_local);
                }
                environ_local = FirstExp(environ_local);
              }
            }
            else {
              environ_local = AndTests(environ_local);
              cVar1 = IsTheEmptyList(environ_local);
              if (cVar1 != '\0') {
                return True;
              }
              while (cVar1 = IsLastExp(environ_local), cVar1 == '\0') {
                pSVar2 = FirstExp(environ_local);
                pSVar2 = Eval(pSVar2,procedure);
                cVar1 = IsFalse(pSVar2);
                if (cVar1 != '\0') {
                  return False;
                }
                environ_local = RestExps(environ_local);
              }
              environ_local = FirstExp(environ_local);
            }
          }
          else {
            environ_local = LetToApplication(environ_local);
          }
        }
        else {
          environ_local = CondToIf(environ_local);
        }
      }
      else {
        environ_local = BeginAction(environ_local);
        while (cVar1 = IsLastExp(environ_local), cVar1 == '\0') {
          pSVar2 = FirstExp(environ_local);
          Eval(pSVar2,procedure);
          environ_local = RestExps(environ_local);
        }
        environ_local = FirstExp(environ_local);
      }
    }
    else {
      pSVar2 = IfPredicate(environ_local);
      pSVar2 = Eval(pSVar2,procedure);
      cVar1 = IsTrue(pSVar2);
      if (cVar1 == '\0') {
        local_40 = IfAlternative(environ_local);
      }
      else {
        local_40 = IfConsequent(environ_local);
      }
      environ_local = local_40;
    }
  }
  pSVar2 = EvalAssignment(environ_local,procedure);
  return pSVar2;
}

Assistant:

extern SchemeObject*
Eval(SchemeObject* exp, SchemeObject* environ)
{
    SchemeObject* procedure;
    SchemeObject* arguments;
    SchemeObject* result;

    tail:
    if (IsSelfEvaluating(exp)) {
        return exp;
    } else if (IsVariable(exp)) {
        return LookupVariableValue(exp, environ);
    } else if (IsQuote(exp)) {
        return TextOfQuotation(exp);
    } else if (IsAssignment(exp)) {
        return EvalAssignment(exp, environ);
    } else if (IsDefine(exp)) {
        return EvalDefinition(exp, environ);
    } else if (IsIf(exp)) {
        exp = IsTrue(Eval(IfPredicate(exp), environ)) ? IfConsequent(exp) : IfAlternative(exp);
        goto tail;
    } else if (IsLambda(exp)) {
        return MakeCompoundProc(LambdaParameters(exp), LambdaBody(exp), environ);
    } else if (IsBegin(exp)) {
        exp = BeginAction(exp);

        while (!IsLastExp(exp)) {
            Eval(FirstExp(exp), environ);
            exp = RestExps(exp);
        }
        exp = FirstExp(exp);

        goto tail;
    } else if (IsCond(exp)) {
        exp = CondToIf(exp);
        goto tail;
    } else if (IsLet(exp)) {
        exp = LetToApplication(exp);
        goto tail;
    } else if (IsAnd(exp)) {
        exp = AndTests(exp);
        if (IsTheEmptyList(exp)) {
            return True;
        }
        while (!IsLastExp(exp)) {
            result = Eval(FirstExp(exp), environ);
            if (IsFalse(result)) {
                return False;
            }
            exp = RestExps(exp);
        }
        exp = FirstExp(exp);
        goto tail;
    } else if (IsOr(exp)) {
        exp = OrTests(exp);
        if (IsTheEmptyList(exp)) {
            return False;
        }
        while (!IsLastExp(exp)) {
            result = Eval(FirstExp(exp), environ);
            if (IsTrue(result)) {
                return True;
            }
            exp = RestExps(exp);
        }
        exp = FirstExp(exp);
        goto tail;
    } else if (IsApplication(exp)) {
        procedure = Eval(Operator(exp), environ);
        arguments = ListOfValues(Operands(exp), environ);

        /* handle eval specially for tail call requirement */
        if (IsPrimitiveProc(procedure) && procedure->data.primitive_proc.fn == EvalProc) {
            exp = EvalExpression(arguments);
            environ = EvalEnvironment(arguments);
            goto tail;
        }

        /* handle apply specially for tail call requirement */
        if (IsPrimitiveProc(procedure) && procedure->data.primitive_proc.fn == ApplyProc) {
            procedure = ApplyOperator(arguments);
            arguments = ApplyOperands(arguments);
        }

        if (IsPrimitiveProc(procedure)) {
            return (procedure->data.primitive_proc.fn)(arguments);
        } else if (IsCompoundProc(procedure)) {
            environ = ExtendEnvironment(procedure->data.compound_proc.parameters,
                                        arguments,
                                        procedure->data.compound_proc.env);
            exp = MakeBegin(procedure->data.compound_proc.body);
            goto tail;
        } else {
            fprintf(stderr, "unknown procedure type.\n");
            exit(1);
        }
    } else {
        fprintf(stderr, "cannot eval unknown expression type.\n");
        exit(1);
    }
    fprintf(stderr, "eval illegal state.\n");
    exit(1);
}